

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O1

void mergeRelatedLines(vector<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_> *lines,
                      Mat *img)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  pointer pVVar7;
  int iVar8;
  int iVar9;
  pointer pVVar10;
  float fVar11;
  float fVar12;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  
  pVVar10 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (pVVar10 !=
      (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      fVar2 = (pVVar10->super_Matx<float,_2,_1>).val[0];
      if ((((fVar2 != 0.0) || (NAN(fVar2))) ||
          (fVar12 = (pVVar10->super_Matx<float,_2,_1>).val[1], fVar12 != -100.0)) || (NAN(fVar12)))
      {
        fVar12 = (pVVar10->super_Matx<float,_2,_1>).val[1];
        if ((fVar12 <= 0.7853982) || (2.3561945 <= fVar12)) {
          fVar11 = cosf(fVar12);
          local_44 = (int)(fVar2 / fVar11);
          local_50 = **(int **)(img + 0x40);
          fVar11 = tanf(fVar12);
          fVar12 = cosf(fVar12);
          local_4c = (int)(fVar2 / fVar12 + (float)-local_50 / fVar11);
          local_48 = 0;
        }
        else {
          fVar11 = sinf(fVar12);
          local_48 = (int)(fVar2 / fVar11);
          local_4c = *(int *)(*(long *)(img + 0x40) + 4);
          fVar11 = tanf(fVar12);
          fVar12 = sinf(fVar12);
          local_50 = (int)(fVar2 / fVar12 + (float)-local_4c / fVar11);
          local_44 = 0;
        }
        pVVar7 = (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pVVar7 != (lines->
                      super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            fVar2 = (pVVar10->super_Matx<float,_2,_1>).val[0];
            if ((fVar2 != (pVVar7->super_Matx<float,_2,_1>).val[0]) ||
               (NAN(fVar2) || NAN((pVVar7->super_Matx<float,_2,_1>).val[0]))) {
LAB_001099d5:
              fVar2 = (pVVar7->super_Matx<float,_2,_1>).val[0];
              if ((ABS(fVar2 - (pVVar10->super_Matx<float,_2,_1>).val[0]) < 20.0) &&
                 (fVar12 = (pVVar7->super_Matx<float,_2,_1>).val[1],
                 ABS(fVar12 - (pVVar10->super_Matx<float,_2,_1>).val[1]) < 0.17453292)) {
                if ((fVar12 <= 0.7853982) || (2.3561945 <= fVar12)) {
                  fVar11 = cosf(fVar12);
                  iVar9 = (int)(fVar2 / fVar11);
                  iVar5 = **(int **)(img + 0x40);
                  fVar11 = tanf(fVar12);
                  fVar12 = cosf(fVar12);
                  iVar6 = (int)(fVar2 / fVar12 + (float)-iVar5 / fVar11);
                  iVar8 = 0;
                }
                else {
                  fVar11 = sinf(fVar12);
                  iVar8 = (int)(fVar2 / fVar11);
                  iVar6 = *(int *)(*(long *)(img + 0x40) + 4);
                  fVar11 = tanf(fVar12);
                  fVar12 = sinf(fVar12);
                  iVar5 = (int)(fVar2 / fVar12 + (float)-iVar6 / fVar11);
                  iVar9 = 0;
                }
                if (((double)(iVar9 - local_44) * (double)(iVar9 - local_44) +
                     (double)((iVar8 - local_48) * (iVar8 - local_48)) < 4096.0) &&
                   ((double)(iVar6 - local_4c) * (double)(iVar6 - local_4c) +
                    (double)((iVar5 - local_50) * (iVar5 - local_50)) < 4096.0)) {
                  fVar2 = (pVVar10->super_Matx<float,_2,_1>).val[1];
                  (pVVar10->super_Matx<float,_2,_1>).val[0] =
                       ((pVVar10->super_Matx<float,_2,_1>).val[0] +
                       (pVVar7->super_Matx<float,_2,_1>).val[0]) * 0.5;
                  (pVVar10->super_Matx<float,_2,_1>).val[1] =
                       (fVar2 + (pVVar7->super_Matx<float,_2,_1>).val[1]) * 0.5;
                  *(undefined8 *)(pVVar7->super_Matx<float,_2,_1>).val = 0xc2c8000000000000;
                }
              }
            }
            else {
              bVar4 = true;
              do {
                bVar3 = bVar4;
                if (!bVar3) goto LAB_00109c12;
                fVar2 = (pVVar10->super_Matx<float,_2,_1>).val[1];
                pfVar1 = (pVVar7->super_Matx<float,_2,_1>).val + 1;
              } while ((fVar2 == *pfVar1) && (bVar4 = false, !NAN(fVar2) && !NAN(*pfVar1)));
              if (bVar3) goto LAB_001099d5;
            }
LAB_00109c12:
            pVVar7 = pVVar7 + 1;
          } while (pVVar7 != (lines->
                             super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      pVVar10 = pVVar10 + 1;
    } while (pVVar10 !=
             (lines->super__Vector_base<cv::Vec<float,_2>,_std::allocator<cv::Vec<float,_2>_>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void mergeRelatedLines(vector<Vec2f> *lines, Mat &img){
    vector<Vec2f>::iterator current;
    for(current=lines->begin();current!=lines->end();current++){
        if((*current)[0]==0 && (*current)[1]==-100) continue;
        float p1 = (*current)[0];
        float theta1 = (*current)[1];
        Point pt1current, pt2current;
        if(theta1>CV_PI*45/180 && theta1<CV_PI*135/180){
            pt1current.x=0;

            pt1current.y = p1/sin(theta1);

            pt2current.x=img.size().width;
            pt2current.y=-pt2current.x/tan(theta1) + p1/sin(theta1);
        }
        else{
            pt1current.y=0;

            pt1current.x=p1/cos(theta1);

            pt2current.y=img.size().height;
            pt2current.x=-pt2current.y/tan(theta1) + p1/cos(theta1);

        }
        vector<Vec2f>::iterator    pos;
        for(pos=lines->begin();pos!=lines->end();pos++){
            if(*current==*pos) continue;
            if(fabs((*pos)[0]-(*current)[0])<20 && fabs((*pos)[1]-(*current)[1])<CV_PI*10/180){
                float p = (*pos)[0];
                float theta = (*pos)[1];
                Point pt1, pt2;
                if((*pos)[1]>CV_PI*45/180 && (*pos)[1]<CV_PI*135/180){
                    pt1.x=0;
                    pt1.y = p/sin(theta);
                    pt2.x=img.size().width;
                    pt2.y=-pt2.x/tan(theta) + p/sin(theta);
                }
                else{
                    pt1.y=0;
                    pt1.x=p/cos(theta);
                    pt2.y=img.size().height;
                    pt2.x=-pt2.y/tan(theta) + p/cos(theta);
                }
                if(((double)(pt1.x-pt1current.x)*(pt1.x-pt1current.x) + (pt1.y-pt1current.y)*(pt1.y-pt1current.y)<64*64) &&
                    ((double)(pt2.x-pt2current.x)*(pt2.x-pt2current.x) + (pt2.y-pt2current.y)*(pt2.y-pt2current.y)<64*64))
                {
                    // Merge the two
                    (*current)[0] = ((*current)[0]+(*pos)[0])/2;

                    (*current)[1] = ((*current)[1]+(*pos)[1])/2;

                    (*pos)[0]=0;
                    (*pos)[1]=-100;
                }
            }
        }
    }
}